

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitSIMDReplace(PrintExpressionContents *this,SIMDReplace *curr)

{
  ostream *this_00;
  
  prepareColor(this->o);
  if ((ulong)curr->op < 7) {
    std::operator<<(this->o,&DAT_00e24110 + *(int *)(&DAT_00e24110 + (ulong)curr->op * 4));
  }
  Colors::normal(this->o);
  this_00 = std::operator<<(this->o," ");
  std::ostream::operator<<(this_00,(uint)curr->index);
  return;
}

Assistant:

void visitSIMDReplace(SIMDReplace* curr) {
    prepareColor(o);
    switch (curr->op) {
      case ReplaceLaneVecI8x16:
        o << "i8x16.replace_lane";
        break;
      case ReplaceLaneVecI16x8:
        o << "i16x8.replace_lane";
        break;
      case ReplaceLaneVecI32x4:
        o << "i32x4.replace_lane";
        break;
      case ReplaceLaneVecI64x2:
        o << "i64x2.replace_lane";
        break;
      case ReplaceLaneVecF16x8:
        o << "f16x8.replace_lane";
        break;
      case ReplaceLaneVecF32x4:
        o << "f32x4.replace_lane";
        break;
      case ReplaceLaneVecF64x2:
        o << "f64x2.replace_lane";
        break;
    }
    restoreNormalColor(o);
    o << " " << int(curr->index);
  }